

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O1

void __thiscall demo::CaptureLogging::AppendLine(CaptureLogging *this,string *line)

{
  size_t *psVar1;
  int iVar2;
  _Node *p_Var3;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->data_lock_);
  if (iVar2 == 0) {
    p_Var3 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>
                       ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                        &this->lines_,line);
    std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
    psVar1 = &(this->lines_).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->data_lock_);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,(line->_M_dataplus)._M_p,line->_M_string_length);
    return;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

void CaptureLogging::AppendLine(const std::string& line) {
  {
    std::lock_guard<std::mutex> lock(data_lock_);
    lines_.emplace_back(line);
  }
  DefaultAppendLine(line);
}